

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert2Pow2(EExpr *__return_storage_ptr__,
              ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *this,EExpr *el)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  VarOrConst VVar2;
  NodeRange NVar3;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  local_58;
  
  this_00 = &this->flat_cvt_;
  local_58.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>.args_
  ._M_elems[0] = (_Type)FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        ::Convert2Var((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                       *)this_00,&el->super_QuadraticExpr);
  paVar1 = &local_58.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_58.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_58.super_FunctionalConstraint.result_var_ = -1;
  local_58.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_58.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>.
  params_._M_elems[0] = (_Type)2.0;
  local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1
  ;
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)this_00,&local_58);
  value = VVar2.field_1;
  if (((undefined1  [16])VVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)this_00,value.c_);
    value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar3.ir_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar1)
  {
    operator_delete(local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,CONCAT71(local_58.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_allocated_capacity._1_7_,
                              local_58.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_local_buf[0]) + 1);
  }
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (&__return_storage_ptr__->super_QuadraticExpr,(Variable)value.var_);
  return __return_storage_ptr__;
}

Assistant:

EExpr Convert2Pow2(EExpr&& el) {
    auto affexpr2var = Convert2Var( std::move(el) );
    auto pow2var = GetFlatCvt().AssignResultVar2Args(
          PowConstExpConstraint{ {{affexpr2var}}, {2.0} });
    return EExpr::Variable{ pow2var };
  }